

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make_constant<int,__11>(any *this,anon_enum_32 *args)

{
  anon_enum_32 aVar1;
  baseHolder *pbVar2;
  any aVar3;
  
  if ((DAT_003383d0 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar2 = *(baseHolder **)
              (&holder<cs_impl::path_cs_ext::path_info>::allocator + DAT_003383d0 * 8);
    DAT_003383d0 = DAT_003383d0 + -1;
  }
  aVar1 = *args;
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_00328990;
  *(anon_enum_32 *)&pbVar2[1]._vptr_baseHolder = aVar1;
  if ((DAT_00339e90 == 0) || (cs::global_thread_counter != 0)) {
    aVar3.mDat = (proxy *)operator_new(0x18);
  }
  else {
    aVar3.mDat = (proxy *)(&cs::null_pointer)[DAT_00339e90];
    DAT_00339e90 = DAT_00339e90 + -1;
  }
  (aVar3.mDat)->is_rvalue = false;
  (aVar3.mDat)->protect_level = 2;
  (aVar3.mDat)->refcount = 1;
  (aVar3.mDat)->data = pbVar2;
  this->mDat = (proxy *)aVar3;
  return (any)aVar3.mDat;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}